

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qset.h
# Opt level: O3

QList<QString> * __thiscall
QSet<QString>::values(QList<QString> *__return_storage_ptr__,QSet<QString> *this)

{
  ulong uVar1;
  size_t asize;
  Data *pDVar2;
  ulong uVar3;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QString *)0x0;
  (__return_storage_ptr__->d).size = 0;
  pDVar2 = (this->q_hash).d;
  if (pDVar2 == (Data *)0x0) {
    asize = 0;
  }
  else {
    asize = pDVar2->size;
  }
  QList<QString>::reserve(__return_storage_ptr__,asize);
  pDVar2 = (this->q_hash).d;
  if (pDVar2 == (Data *)0x0) {
    pDVar2 = (Data *)0x0;
    uVar3 = 0;
    goto LAB_00134d37;
  }
  if (pDVar2->spans->offsets[0] == 0xff) {
    uVar1 = 1;
    do {
      uVar3 = uVar1;
      if (pDVar2->numBuckets == uVar3) goto LAB_00134d34;
      uVar1 = uVar3 + 1;
      if (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] != 0xff) goto LAB_00134d37;
    } while( true );
  }
  uVar3 = 0;
LAB_00134d3f:
  QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
            ((QMovableArrayOps<QString> *)__return_storage_ptr__,(__return_storage_ptr__->d).size,
             (QString *)
             (((pDVar2->spans[uVar3 >> 7].entries)->storage).data +
             (uint)pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] * 0x18));
  QList<QString>::end(__return_storage_ptr__);
  do {
    if (pDVar2->numBuckets - 1 == uVar3) goto LAB_00134d34;
    uVar3 = uVar3 + 1;
  } while (pDVar2->spans[uVar3 >> 7].offsets[(uint)uVar3 & 0x7f] == 0xff);
  goto LAB_00134d37;
LAB_00134d34:
  uVar3 = 0;
  pDVar2 = (Data *)0x0;
LAB_00134d37:
  if (uVar3 == 0 && pDVar2 == (Data *)0x0) {
    return __return_storage_ptr__;
  }
  goto LAB_00134d3f;
}

Assistant:

Q_OUTOFLINE_TEMPLATE QList<T> QSet<T>::values() const
{
    QList<T> result;
    result.reserve(size());
    typename QSet<T>::const_iterator i = constBegin();
    while (i != constEnd()) {
        result.append(*i);
        ++i;
    }
    return result;
}